

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_padlock.c
# Opt level: O0

int padlock_rand_bytes(uchar *output,int count)

{
  int in_ESI;
  undefined1 *in_RDI;
  uint buf;
  uint eax;
  undefined1 local_1c [4];
  uint local_18;
  int local_14;
  undefined1 *local_10;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  while( true ) {
    if (local_14 < 8) {
      while( true ) {
        if (local_14 < 1) {
          OPENSSL_cleanse(local_1c,4);
          return 1;
        }
        local_18 = padlock_xstore(local_1c,3);
        if ((local_18 & 0x40) == 0) break;
        if ((local_18 & 0x7c00) != 0) {
          return 0;
        }
        if ((local_18 & 0x1f) != 0) {
          if ((local_18 & 0x1f) != 1) {
            return 0;
          }
          *local_10 = local_1c[0];
          local_14 = local_14 + -1;
          local_10 = local_10 + 1;
        }
      }
      return 0;
    }
    local_18 = padlock_xstore(local_10,0);
    if ((local_18 & 0x40) == 0) {
      return 0;
    }
    if ((local_18 & 0x7c00) != 0) break;
    if ((local_18 & 0x1f) != 0) {
      if ((local_18 & 0x1f) != 8) {
        return 0;
      }
      local_10 = local_10 + 8;
      local_14 = local_14 + -8;
    }
  }
  return 0;
}

Assistant:

static int padlock_rand_bytes(unsigned char *output, int count)
{
    unsigned int eax, buf;

    while (count >= 8) {
        eax = padlock_xstore(output, 0);
        if (!(eax & (1 << 6)))
            return 0;           /* RNG disabled */
        /* this ---vv--- covers DC bias, Raw Bits and String Filter */
        if (eax & (0x1F << 10))
            return 0;
        if ((eax & 0x1F) == 0)
            continue;           /* no data, retry... */
        if ((eax & 0x1F) != 8)
            return 0;           /* fatal failure...  */
        output += 8;
        count -= 8;
    }
    while (count > 0) {
        eax = padlock_xstore(&buf, 3);
        if (!(eax & (1 << 6)))
            return 0;           /* RNG disabled */
        /* this ---vv--- covers DC bias, Raw Bits and String Filter */
        if (eax & (0x1F << 10))
            return 0;
        if ((eax & 0x1F) == 0)
            continue;           /* no data, retry... */
        if ((eax & 0x1F) != 1)
            return 0;           /* fatal failure...  */
        *output++ = (unsigned char)buf;
        count--;
    }
    OPENSSL_cleanse(&buf, sizeof(buf));

    return 1;
}